

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

ch_primitive ch_vm_call(ch_context *context,ch_string *function_name)

{
  ch_stack *stack;
  byte bVar1;
  ch_dataptr function_ptr;
  ch_jmpptr offset;
  uint8_t *puVar2;
  ch_upvalue *pcVar3;
  byte *pbVar4;
  size_t sVar5;
  ch_primitive_type cVar6;
  _Bool _Var7;
  uint uVar8;
  ch_string *pcVar9;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 aVar10;
  ch_primitive *pcVar11;
  ch_upvalue *pcVar12;
  ch_argcount argcount;
  ch_upvalue **ppcVar13;
  char *pcVar14;
  char *error;
  ulong uVar15;
  ch_upvalue *pcVar16;
  uint8_t uVar17;
  ch_stack_addr index;
  ch_exit exit;
  ulong uVar18;
  ch_primitive cVar19;
  ch_primitive value_00;
  ch_primitive value_01;
  ch_primitive entry;
  ch_primitive primitive;
  ch_primitive entry_00;
  ch_primitive value_02;
  ch_primitive entry_01;
  ch_primitive value_03;
  ulong uStack_a0;
  ch_primitive args [2];
  double value;
  ulong local_58;
  ch_table *local_50;
  ch_upvalue **local_48;
  ch_primitive *local_40;
  ch_string *local_38;
  
  stack = &context->stack;
  sVar5 = (context->stack).size;
  local_40 = &context->program_return_value;
  local_48 = &context->open_upvalues;
  local_50 = &context->globals;
  local_38 = function_name;
LAB_00101ad8:
  if (context->exit != RUNNING) {
    if (context->exit == EXIT_OK) {
      puts("Program has halted.");
    }
    else {
      printf("Runtime error: %d.\n");
    }
    cVar19._4_4_ = 0;
    cVar19.type = (context->program_return_value).type;
    cVar19.field_1 =
         (anon_union_8_4_dd993ae3_for_ch_primitive_1)
         (anon_union_8_4_dd993ae3_for_ch_primitive_1)
         (context->program_return_value).field_1.object_value;
    return cVar19;
  }
  puVar2 = context->pcurrent;
  uVar17 = *puVar2;
  context->pcurrent = puVar2 + 1;
  switch(uVar17) {
  case '\0':
    context->exit = EXIT_OK;
    goto LAB_00101ad8;
  case '\x01':
    _Var7 = ch_stack_pop(stack,args);
    if (_Var7) goto LAB_00101ad8;
    break;
  case '\x02':
    context->pcurrent = puVar2 + 5;
    uVar17 = puVar2[1];
    goto LAB_00101d8e;
  case '\x03':
    index = (int)(context->stack).size - 1;
    goto LAB_00101cd1;
  case '\x04':
    context->pcurrent = puVar2 + 5;
    aVar10 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)
             ((anon_union_8_4_dd993ae3_for_ch_primitive_1 *)
             (context->pstart + *(uint *)(puVar2 + 1)))->object_value;
LAB_00102119:
    uStack_a0 = 0;
    goto LAB_0010211e;
  case '\x05':
    _Var7 = ch_stack_pop(stack,args);
    if (_Var7) {
      value_00._4_4_ = 0;
      value_00.type = args[0].type;
      value_00.field_1.number_value = args[0].field_1.number_value;
      _Var7 = ch_checknumber(context,value_00,&value);
      if (_Var7) {
        aVar10.number_value = value ^ 0x8000000000000000;
        goto LAB_00102119;
      }
      goto LAB_00101ad8;
    }
    break;
  case '\x06':
  case '\b':
  case '\n':
  case '\v':
    ch_stack_pop(stack,args);
    ch_stack_pop(stack,args + 1);
    if (args[0].type != args[1].type) {
      pcVar14 = "Can only apply binary operator on matching types.";
LAB_00102093:
      exit = EXIT_INCORRECT_TYPE;
      goto LAB_00102099;
    }
    if (args[0].type == PRIMITIVE_OBJECT) {
      if ((args[0].field_1.object_value)->type != (args[1].field_1.object_value)->type) {
        pcVar14 = "Can only apply binary operator on matching object types.";
        goto LAB_00102093;
      }
      if ((args[0].field_1.object_value)->type == TYPE_STRING) {
        if (uVar17 == '\x06') {
          uVar8 = 3;
          aVar10.number_value =
               (double)ch_concatstring(context,args[1].field_1.number_value,
                                       args[0].field_1.number_value);
        }
        else {
          aVar10.number_value = 0.0;
          ch_runtime_error(context,EXIT_UNSUPPORTED_OPERATION,"Can only use + operator on strings.")
          ;
          uVar8 = 2;
        }
        uStack_a0 = (ulong)uVar8;
        goto LAB_0010211e;
      }
      pcVar14 = "Cannot apply binary operation to object type: %d";
    }
    else {
      if (args[0].type == PRIMITIVE_NUMBER) {
        switch(uVar17) {
        case '\x06':
          aVar10.number_value = args[0].field_1.number_value + args[1].field_1.number_value;
          break;
        default:
          ch_runtime_error(context,EXIT_UNKNOWN_INSTRUCTION,"Unsupported instruction for binary op."
                          );
          aVar10.number_value = 0.0;
          break;
        case '\b':
          aVar10.number_value = args[0].field_1.number_value - args[1].field_1.number_value;
          break;
        case '\n':
          aVar10.number_value = args[0].field_1.number_value * args[1].field_1.number_value;
          break;
        case '\v':
          aVar10.number_value = args[0].field_1.number_value / args[1].field_1.number_value;
        }
        goto LAB_00102119;
      }
      pcVar14 = "Cannot apply binary operation to primitive type: %d";
    }
    ch_runtime_error(context,EXIT_INCORRECT_TYPE,pcVar14);
    goto LAB_00101ad8;
  case '\a':
  case '\t':
    _Var7 = ch_stack_pop(stack,args);
    if (_Var7) {
      if (args[0].type != PRIMITIVE_NUMBER) {
        pcVar14 = "Expected number for addone, subone op";
        goto LAB_00102093;
      }
      aVar10.number_value =
           *(double *)(&DAT_00105290 + (ulong)(uVar17 == '\a') * 8) + args[0].field_1.number_value;
      goto LAB_00102119;
    }
    break;
  case '\f':
    aVar10.object_value = &read_string(context)->object;
    goto LAB_00101ca6;
  case '\r':
    uStack_a0 = 1;
    goto LAB_00101db5;
  case '\x0e':
    uStack_a0 = 1;
    aVar10.number_value = 4.94065645841247e-324;
    goto LAB_0010211e;
  case '\x0f':
    context->pcurrent = puVar2 + 2;
    aVar10._1_7_ = 0;
    aVar10.boolean_value = (_Bool)puVar2[1];
    uStack_a0 = 4;
    goto LAB_0010211e;
  case '\x10':
    uStack_a0 = 2;
LAB_00101db5:
    aVar10.number_value = 0.0;
    goto LAB_0010211e;
  case '\x11':
    context->pcurrent = puVar2 + 5;
    index = (uint)puVar2[1] + (context->call_stack).calls[(context->call_stack).size - 1].stack_addr
    ;
LAB_00101cd1:
    ch_stack_copy(stack,index);
    goto LAB_00101ad8;
  case '\x12':
    _Var7 = ch_stack_pop(stack,args);
    if (_Var7) {
      pbVar4 = context->pcurrent;
      context->pcurrent = pbVar4 + 4;
      entry_01._4_4_ = 0;
      entry_01.type = args[0].type;
      entry_01.field_1.number_value = args[0].field_1.number_value;
      ch_stack_set(stack,(uint)*pbVar4 +
                         (context->call_stack).calls[(context->call_stack).size - 1].stack_addr,
                   entry_01);
      goto LAB_00101ad8;
    }
    break;
  case '\x13':
    context->pcurrent = puVar2 + 2;
    pcVar11 = ((context->call_stack).calls[(context->call_stack).size - 1].closure)->upvalues
              [puVar2[1]]->value;
    uStack_a0 = (ulong)pcVar11->type;
    aVar10 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)(pcVar11->field_1).object_value;
    goto LAB_0010211e;
  case '\x14':
    context->pcurrent = puVar2 + 2;
    bVar1 = puVar2[1];
    _Var7 = ch_stack_pop(stack,args);
    if (_Var7) {
      pcVar11 = ((context->call_stack).calls[(context->call_stack).size - 1].closure)->upvalues
                [bVar1]->value;
      *(ulong *)pcVar11 = CONCAT44(args[0]._4_4_,args[0].type);
      pcVar11->field_1 = args[0].field_1;
      goto LAB_00101ad8;
    }
    break;
  case '\x15':
    pcVar11 = ch_stack_get(stack,(int)(context->stack).size - 1);
    close_upvalues(context,pcVar11);
    uVar17 = '\x01';
LAB_00101d8e:
    ch_stack_popn(stack,uVar17);
    goto LAB_00101ad8;
  case '\x16':
  case '\x17':
    pcVar9 = read_string(context);
    _Var7 = ch_stack_pop(stack,args);
    aVar10 = args[0].field_1;
    cVar6 = args[0].type;
    if (_Var7) {
      value_03._4_4_ = 0;
      value_03.type = args[0].type;
      pcVar11 = ch_table_get(local_50,pcVar9);
      if (uVar17 == '\x16') {
        if (pcVar11 != (ch_primitive *)0x0) {
          pcVar11->type = cVar6;
          pcVar11->field_1 = aVar10;
          goto LAB_00101ad8;
        }
        pcVar14 = pcVar9->value;
        error = "Cannot assign to non existing global variable: %s.";
      }
      else {
        if (pcVar11 == (ch_primitive *)0x0) {
          value_03.field_1.number_value = aVar10.number_value;
          ch_table_set(local_50,pcVar9,value_03);
          goto LAB_00101ad8;
        }
        pcVar14 = pcVar9->value;
        error = "Cannot redefine global variable: %s.";
      }
      ch_runtime_error(context,EXIT_GLOBAL_NOT_FOUND,error,pcVar14);
      goto LAB_00101ad8;
    }
    context->exit = EXIT_STACK_EMPTY;
    goto LAB_00101ad8;
  case '\x18':
    pcVar9 = read_string(context);
    get_global(context,pcVar9);
    goto LAB_00101ad8;
  case '\x19':
    get_global(context,local_38);
    _Var7 = ch_stack_pop(stack,args);
    argcount = (ch_argcount)sVar5;
    if (_Var7) {
LAB_00102008:
      primitive._4_4_ = 0;
      primitive.type = args[0].type;
      primitive.field_1.number_value = args[0].field_1.number_value;
      try_call(context,primitive,argcount);
      goto LAB_00101ad8;
    }
    break;
  case '\x1a':
    context->pcurrent = puVar2 + 2;
    argcount = puVar2[1];
    _Var7 = ch_stack_pop(stack,args);
    if (_Var7) goto LAB_00102008;
    break;
  case '\x1b':
    call_return(context);
    goto LAB_00101ad8;
  case '\x1c':
    _Var7 = ch_stack_pop(stack,args);
    if (_Var7) {
      call_return(context);
      if ((context->call_stack).size != 0) {
        uStack_a0 = (ulong)args[0].type;
        aVar10 = args[0].field_1;
        goto LAB_0010211e;
      }
      *(ulong *)local_40 = CONCAT44(args[0]._4_4_,args[0].type);
      local_40->field_1 = args[0].field_1;
      goto LAB_00101ad8;
    }
    break;
  case '\x1d':
    context->pcurrent = puVar2 + 5;
    offset = *(ch_jmpptr *)(puVar2 + 1);
    cVar19 = ch_stack_peek(stack,0);
    value_02._4_4_ = 0;
    value_02.type = cVar19.type;
    value_02.field_1.number_value = cVar19.field_1.number_value;
    _Var7 = ch_primitive_isfalsy(value_02);
    if (_Var7) {
      jump(context,offset);
    }
    goto LAB_00101ad8;
  case '\x1e':
    context->pcurrent = puVar2 + 5;
    jump(context,*(ch_jmpptr *)(puVar2 + 1));
    goto LAB_00101ad8;
  case '\x1f':
    context->pcurrent = puVar2 + 5;
    function_ptr = *(ch_dataptr *)(puVar2 + 1);
    context->pcurrent = puVar2 + 6;
    aVar10.object_value = &ch_loadfunction(function_ptr,puVar2[5])->object;
LAB_00101ca6:
    uStack_a0 = 3;
LAB_0010211e:
    entry_00.field_1.object_value = aVar10.object_value;
    entry_00._0_8_ = uStack_a0;
    _Var7 = ch_stack_push(stack,entry_00);
    if (!_Var7) goto LAB_0010212b;
    goto LAB_00101ad8;
  case ' ':
    context->pcurrent = puVar2 + 2;
    bVar1 = puVar2[1];
    uVar15 = (ulong)bVar1;
    _Var7 = ch_stack_pop(stack,args);
    if (!_Var7) break;
    value = 0.0;
    value_01._4_4_ = 0;
    value_01.type = args[0].type;
    value_01.field_1.number_value = args[0].field_1.number_value;
    _Var7 = ch_checkfunction(context,value_01,(ch_function **)&value);
    if (_Var7) {
      aVar10.number_value = (double)ch_loadclosure(value,bVar1);
      entry.field_1.object_value = aVar10.object_value;
      entry._0_8_ = 3;
      _Var7 = ch_stack_push(stack,entry);
      if (_Var7) {
        local_58 = uVar15;
        for (uVar18 = 0; uVar18 != uVar15; uVar18 = uVar18 + 1) {
          puVar2 = context->pcurrent;
          context->pcurrent = puVar2 + 1;
          uVar8 = (context->call_stack).size - 1;
          uVar17 = *puVar2;
          context->pcurrent = puVar2 + 2;
          if (uVar17 == '\0') {
            pcVar12 = ((context->call_stack).calls[uVar8].closure)->upvalues[puVar2[1]];
          }
          else {
            pcVar11 = ch_stack_get(stack,(uint)puVar2[1] +
                                         (context->call_stack).calls[uVar8].stack_addr);
            ppcVar13 = local_48;
            pcVar16 = (ch_upvalue *)0x0;
            while (pcVar3 = *ppcVar13, pcVar3 != (ch_upvalue *)0x0) {
              if (pcVar3->value <= pcVar11) {
                uVar15 = local_58;
                pcVar12 = pcVar3;
                if (pcVar3->value == pcVar11) goto LAB_00101ed2;
                break;
              }
              pcVar16 = pcVar3;
              ppcVar13 = &pcVar3->next;
            }
            pcVar12 = ch_loadupvalue(pcVar11);
            pcVar12->next = pcVar3;
            ppcVar13 = &pcVar16->next;
            if (pcVar16 == (ch_upvalue *)0x0) {
              ppcVar13 = local_48;
            }
            *ppcVar13 = pcVar12;
            uVar15 = local_58;
          }
LAB_00101ed2:
          (*(ch_upvalue ***)(aVar10.object_value + 4))[uVar18] = pcVar12;
        }
      }
      else {
LAB_0010212b:
        context->exit = EXIT_STACK_SIZE_EXCEEDED;
      }
    }
    goto LAB_00101ad8;
  default:
    exit = EXIT_UNKNOWN_INSTRUCTION;
    pcVar14 = "Unknown instruction.";
LAB_00102099:
    ch_runtime_error(context,exit,pcVar14);
    goto LAB_00101ad8;
  }
  context->exit = EXIT_STACK_EMPTY;
  goto LAB_00101ad8;
}

Assistant:

ch_primitive ch_vm_call(ch_context *context, ch_string *function_name) {
  size_t initial_stack_size = context->stack.size;

  while (context->exit == RUNNING) {
    uint8_t opcode = *(context->pcurrent);
    context->pcurrent++;

    switch (opcode) {
    case OP_NUMBER: {
      double value = LOAD_NUMBER(context, VM_READ_PTR(context));
      STACK_PUSH(context, MAKE_NUMBER(value));
      break;
    }
    case OP_STRING: {
      ch_string* string = read_string(context);
      STACK_PUSH(context, MAKE_OBJECT(string));
      break;
    }
    case OP_FALSE: { 
      STACK_PUSH(context, MAKE_BOOLEAN(false));
      break;
    }
    case OP_TRUE: { 
      STACK_PUSH(context, MAKE_BOOLEAN(true));
      break;
    }
    case OP_CHAR: {
      char value = VM_READ_CHAR(context);
      STACK_PUSH(context, MAKE_CHAR(value));
      break;
    }
    case OP_NULL: {
      STACK_PUSH(context, MAKE_NULL());
      break;
    }
    case OP_ADD: 
    case OP_SUB:
    case OP_MUL:
    case OP_DIV: {
      ch_primitive args[2];
      binary_op_args(context, args);

      if (args[0].type != args[1].type) {
        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Can only apply binary operator on matching types.");
        break;
      }

      ch_primitive result;
      if (IS_NUMBER(args[0])) {
        STACK_PUSH(context, binary_op_number(context, args, opcode));
        break;
      }

      if (IS_OBJECT(args[0])) {
        ch_object* object_args[2] = {AS_OBJECT(args[0]), AS_OBJECT(args[1])};
        if (object_args[0]->type != object_args[1]->type) {
          ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Can only apply binary operator on matching object types.");
          break;
        }

        if (IS_STRING(object_args[0])) {
          STACK_PUSH(context, binary_op_string(context, object_args, opcode));
          break;
        }

        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Cannot apply binary operation to object type: %d", object_args[0]->type);
        break;
      }

      ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Cannot apply binary operation to primitive type: %d", args[0].type);
      break;
    }
    case OP_ADDONE:
    case OP_SUBONE: {
      ch_primitive entry;
      STACK_POP(context, &entry);
      if (!IS_NUMBER(entry)) {
        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Expected number for addone, subone op");
        break;
      }

      double value;
      if (opcode == OP_ADDONE) {
        value = AS_NUMBER(entry) + 1;
      } else {
        value = AS_NUMBER(entry) - 1;
      }

      STACK_PUSH(context, MAKE_NUMBER(value));
      break;
    }
    case OP_NEGATE: {
      ch_primitive entry;
      STACK_POP(context, &entry);

      double value;
      if(ch_checknumber(context, entry, &value)) {
        STACK_PUSH(context, MAKE_NUMBER(-value));
      }
      break;
    }
    case OP_HALT: {
      context->exit = EXIT_OK;
      break;
    }
    case OP_POP: {
      ch_primitive entry;
      STACK_POP(context, &entry);
      break;
    }
    case OP_POPN: {
      ch_dataptr num_popped = VM_READ_PTR(context);

      // TODO add runtime check?
      ch_stack_popn(&context->stack, num_popped);
      break;
    }
    case OP_TOP: {
      ch_stack_copy(&context->stack, CH_STACK_ADDR(&context->stack) - 1);
      break;
    }
    case OP_LOAD_LOCAL: {
      uint8_t offset = (uint8_t)VM_READ_PTR(context);
      ch_stack_addr index = CURRENT_CALL(context).stack_addr + offset;
      ch_stack_copy(&context->stack, index);
      break;
    }
    case OP_SET_LOCAL: {
      ch_primitive entry;
      STACK_POP(context, &entry);

      uint8_t offset = (uint8_t)VM_READ_PTR(context);
      ch_stack_addr index = CURRENT_CALL(context).stack_addr + offset;

      ch_stack_set(&context->stack, index, entry);
      break;
    }
    case OP_LOAD_UPVALUE: {
      uint8_t index = VM_READ_ARGCOUNT(context);
      ch_primitive* value = CURRENT_CALL(context).closure->upvalues[index]->value;
      STACK_PUSH(context, *value);
      break;
    }
    case OP_SET_UPVALUE: {
      uint8_t index = VM_READ_ARGCOUNT(context);
      ch_primitive value;
      STACK_POP(context, &value);

      *CURRENT_CALL(context).closure->upvalues[index]->value = value;
      break;
    }
    case OP_CLOSE_UPVALUE: {
      ch_primitive* closed = ch_stack_get(&context->stack, context->stack.size - 1);
      close_upvalues(context, closed);
      ch_stack_popn(&context->stack, 1);
      break;
    }
    case OP_DEFINE_GLOBAL:
    case OP_SET_GLOBAL: {
      ch_string *name = read_string(context);

      ch_primitive entry;
      STACK_POP(context, &entry);

      set_global(context, name, entry, opcode == OP_SET_GLOBAL ? REDEFINE_GLOBAL : CREATE_GLOBAL);

      break;
    }
    case OP_LOAD_GLOBAL: {
      ch_string *name = read_string(context);
      get_global(context, name);
      break;
    }
    case OP_FUNCTION: {
      ch_dataptr function_ptr = VM_READ_PTR(context);
      ch_argcount argcount = VM_READ_ARGCOUNT(context);
      ch_primitive function =
          MAKE_OBJECT(ch_loadfunction(function_ptr, argcount));
      STACK_PUSH(context, function);
      break;
    }
    case OP_CLOSURE: {
      uint8_t upvalue_count = VM_READ_ARGCOUNT(context);
      ch_primitive value;
      STACK_POP(context, &value);
      ch_function* function = NULL;
      if(!ch_checkfunction(context, value, &function)) break;

      ch_closure* closure = ch_loadclosure(function, upvalue_count);
      STACK_PUSH(context, MAKE_OBJECT(closure));

      for(uint8_t i = 0; i < upvalue_count; i++) {
        uint8_t is_local = VM_READ_ARGCOUNT(context);
        uint8_t index = VM_READ_ARGCOUNT(context);

        if (is_local) {
          ch_stack_addr addr = CURRENT_CALL(context).stack_addr + index;
          closure->upvalues[i] = capture_upvalue(context, ch_stack_get(&context->stack, addr));
        } else {
          closure->upvalues[i] = CURRENT_CALL(context).closure->upvalues[index];
        }
      }
      break;
    }
    case OP_BEGIN: {
      get_global(context, function_name);
      ch_primitive function;
      STACK_POP(context, &function);

      try_call(context, function, initial_stack_size);
      break;
    }
    case OP_CALL: {
      ch_argcount argcount = VM_READ_ARGCOUNT(context);

      ch_primitive function;
      STACK_POP(context, &function);

      try_call(context, function, argcount);
      break;
    }
    case OP_RETURN_VALUE: {
      ch_primitive returned_value;
      STACK_POP(context, &returned_value);

      call_return(context);

      // Check if we are returning from the main function
      if (context->call_stack.size != 0) {
        STACK_PUSH(context, returned_value);
      } else {
        context->program_return_value = returned_value;
      }

      break;
    }
    case OP_RETURN_VOID: {
      call_return(context);
      break;
    }
    case OP_JMP: {
      ch_jmpptr ptr = VM_READ_JMPPTR(context);
      jump(context, ptr);
      break;
    }
    case OP_JMP_FALSE: {
      ch_jmpptr ptr = VM_READ_JMPPTR(context);

      ch_primitive peek = ch_stack_peek(&context->stack, 0);

      if (ch_primitive_isfalsy(peek)) {
        jump(context, ptr);
      }
      break;
    }
    default: {
      ch_runtime_error(context, EXIT_UNKNOWN_INSTRUCTION,
                       "Unknown instruction.");
      break;
    }
    }
  }

  if (context->exit != EXIT_OK) {
    printf("Runtime error: %d.\n", context->exit);
  } else {
    printf("Program has halted.\n");
  }

  return context->program_return_value;
}